

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit_model.hpp
# Opt level: O0

int add_tree_internal<float,unsigned_long,long_double>
              (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,float *numeric_data,
              size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,float *Xc,
              unsigned_long *Xc_ind,unsigned_long *Xc_indptr,size_t ndim,size_t ntry,
              CoefType coef_type,bool coef_by_prop,float *sample_weights,size_t nrows,
              size_t max_depth,size_t ncols_per_tree,bool limit_depth,bool penalize_range,
              bool standardize_data,bool fast_bratio,float *col_weights,bool weigh_by_kurt,
              double prob_pick_by_gain_pl,double prob_pick_by_gain_avg,double prob_pick_by_full_gain
              ,double prob_pick_by_dens,double prob_pick_col_by_range,double prob_pick_col_by_var,
              double prob_pick_col_by_kurt,double min_gain,MissingAction missing_action,
              CategSplit cat_split_type,NewCategAction new_cat_action,UseDepthImp depth_imp,
              WeighImpRows weigh_imp_rows,bool all_perm,Imputer *imputer,size_t min_imp_obs,
              TreesIndexer *indexer,float *ref_numeric_data,int *ref_categ_data,
              bool ref_is_col_major,size_t ref_ld_numeric,size_t ref_ld_categ,float *ref_Xc,
              unsigned_long *ref_Xc_ind,unsigned_long *ref_Xc_indptr,uint64_t random_seed)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  uint uVar4;
  runtime_error *prVar5;
  unsigned_long *puVar6;
  void *__s;
  reference pvVar7;
  IsoForest *model_outputs_00;
  ulong uVar8;
  long in_RCX;
  byte bVar9;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_RSI;
  byte bVar10;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_RDI;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_R9;
  byte bVar11;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  power_of_two_growth_policy<2UL> in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  long in_stack_00000008;
  long in_stack_00000020;
  long in_stack_00000028;
  unsigned_long in_stack_00000030;
  undefined4 in_stack_00000038;
  byte in_stack_00000040;
  undefined8 in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  long in_stack_00000060;
  byte in_stack_00000070;
  byte in_stack_00000078;
  byte in_stack_00000080;
  undefined8 in_stack_00000088;
  byte in_stack_00000090;
  undefined4 in_stack_00000098;
  undefined4 in_stack_000000a0;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000b0;
  undefined4 in_stack_000000b8;
  byte in_stack_000000c0;
  long in_stack_000000c8;
  undefined8 in_stack_000000d0;
  long in_stack_000000d8;
  size_t *in_stack_000000e0;
  size_t *in_stack_000000e8;
  byte in_stack_000000f0;
  float *in_stack_000000f8;
  size_t *in_stack_00000100;
  size_t *in_stack_00000108;
  SingleTreeIndex *in_stack_00000110;
  InputData<float,_unsigned_long> *in_stack_00000118;
  undefined8 in_stack_00000120;
  ExtIsoForest single_tree_model_1;
  IsoForest single_tree_model;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  vector<unsigned_long,_std::allocator<unsigned_long>_> terminal_indices;
  size_t n_ref;
  vector<unsigned_long,_std::allocator<unsigned_long>_> temp;
  SignalSwitcher ss;
  bool added_tree;
  size_t last_tree;
  unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
  workspace;
  ModelParams model_params;
  InputData<float,_unsigned_long> input_data;
  size_t col;
  int max_categ;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes;
  pointer in_stack_fffffffffffff968;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree;
  SingleTreeIndex *this;
  InputData<float,_unsigned_long> *in_stack_fffffffffffff970;
  value_type *in_stack_fffffffffffff978;
  SignalSwitcher *in_stack_fffffffffffff980;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff988;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff990;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  undefined8 in_stack_fffffffffffffa00;
  undefined1 standardize;
  float *in_stack_fffffffffffffa08;
  SingleTreeIndex *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined8 in_stack_fffffffffffffa20;
  undefined1 uVar12;
  int *in_stack_fffffffffffffa28;
  float *in_stack_fffffffffffffa30;
  size_t *in_stack_fffffffffffffa70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa78;
  WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>
  *in_stack_fffffffffffffa80;
  size_t *in_stack_fffffffffffffa88;
  size_t *in_stack_fffffffffffffa90;
  unsigned_long *in_stack_fffffffffffffa98;
  int nthreads;
  float *in_stack_fffffffffffffaa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffab0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffab8;
  ExtIsoForest *model_outputs_ext_00;
  reference in_stack_fffffffffffffac0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffac8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffad0;
  TreesIndexer *in_stack_fffffffffffffad8;
  byte local_4d2;
  byte local_4d1;
  long local_4a0;
  undefined4 local_48c;
  long local_480;
  int local_434;
  undefined1 local_3a8 [24];
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined1 local_351 [80];
  undefined1 local_301;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_300;
  undefined1 local_2f0;
  long local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  long local_2d0;
  byte local_2c8;
  byte local_2c7;
  undefined8 local_2c0;
  byte local_2b8;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 local_264;
  byte local_260;
  byte local_25f;
  long local_258;
  unsigned_long local_250;
  undefined4 local_248;
  byte local_244;
  undefined1 local_243;
  undefined1 local_242;
  undefined1 local_241;
  undefined4 local_240;
  undefined4 local_23c;
  undefined8 local_238;
  int local_210;
  long local_200;
  long local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  long local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined1 auStack_1b0 [24];
  undefined1 auStack_198 [24];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 auStack_158 [24];
  undefined1 local_140 [24];
  undefined1 local_128 [24];
  undefined1 local_110 [48];
  int *local_e0;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes_00;
  undefined4 in_stack_ffffffffffffff30;
  int iVar13;
  InputData<float,_unsigned_long> *input_data_00;
  WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>
  *in_stack_ffffffffffffff40;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  byte bVar14;
  
  uVar12 = (undefined1)((ulong)in_stack_fffffffffffffa20 >> 0x38);
  standardize = (undefined1)((ulong)in_stack_fffffffffffffa00 >> 0x38);
  bVar11 = in_stack_00000040 & 1;
  bVar10 = in_stack_00000078 & 1;
  bVar9 = in_stack_00000090 & 1;
  bVar14 = in_stack_000000c0 & 1;
  bVar2 = in_stack_000000f0 & 1;
  if (((((((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) < 0.0) || (in_XMM0_Qa < 0.0)) ||
        (in_XMM2_Qa < 0.0)) || ((in_XMM3_Qa < 0.0 || ((double)in_XMM4_Qa.m_mask < 0.0)))) ||
      (in_XMM5_Qa < 0.0)) || (in_XMM6_Qa < 0.0)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Cannot pass negative probabilities.\n");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((((double)in_XMM4_Qa.m_mask != 0.0) || (NAN((double)in_XMM4_Qa.m_mask))) &&
     (in_R9 != (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"\'prob_pick_col_by_range\' is not compatible with categorical data.\n");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((in_XMM2_Qa != 0.0) || (NAN(in_XMM2_Qa))) &&
     (in_R9 != (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"\'prob_pick_by_full_gain\' is not compatible with categorical data.\n");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((in_XMM6_Qa != 0.0) || (NAN(in_XMM6_Qa))) && (bVar9 != 0)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"\'weigh_by_kurt\' and \'prob_pick_col_by_kurt\' cannot be used together.\n");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((in_stack_00000028 == 0) &&
     (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Must pass \'ndim>0\' in the extended model.\n");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((in_stack_000000d8 != 0) &&
     (bVar3 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                        ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                         in_stack_fffffffffffff980), !bVar3)) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_fffffffffffff970);
    bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff980);
    if ((!bVar3) &&
       (((in_stack_000000e0 == (size_t *)0x0 && (in_stack_000000e8 == (size_t *)0x0)) &&
        (in_stack_00000118 == (InputData<float,_unsigned_long> *)0x0)))) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar5,
                 "\'indexer\' has reference points. Those points must be passed to index them in the new tree to add.\n"
                );
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  input_data_00 = (InputData<float,_unsigned_long> *)0x0;
  local_434 = 0;
  for (impute_nodes_00 = (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0;
      impute_nodes_00 < in_R9;
      impute_nodes_00 =
           (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
           ((long)&(impute_nodes_00->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>).
                   _M_impl.super__Vector_impl_data._M_start + 1)) {
    if (local_434 < *(int *)(in_stack_00000008 + (long)impute_nodes_00 * 4)) {
      local_434 = *(int *)(in_stack_00000008 + (long)impute_nodes_00 * 4);
    }
  }
  if (in_RDI != (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    local_e0 = (int *)((long)&(in_R9->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>).
                              _M_impl.super__Vector_impl_data._M_start + in_RCX);
    puVar6 = std::min<unsigned_long>(&stack0x00000030,(unsigned_long *)&local_e0);
    in_stack_00000030 = *puVar6;
  }
  if (in_stack_00000060 == 0) {
    in_stack_00000060 =
         (long)&(in_R9->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                super__Vector_impl_data._M_start + in_RCX;
  }
  local_210 = local_434;
  if ((in_stack_000000d8 != 0) &&
     (bVar3 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                        ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                         in_stack_fffffffffffff980), local_210 = local_434, bVar3)) {
    in_stack_000000d8 = 0;
  }
  local_200 = in_stack_00000050;
  local_1f8 = (long)&(in_R9->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                     super__Vector_impl_data._M_start + in_RCX;
  local_1f0 = in_stack_00000048;
  local_1e8 = 0;
  local_1e0 = in_stack_00000088;
  local_1c8 = in_stack_00000020;
  local_1c0 = 0;
  local_1b8 = 0;
  iVar13 = local_210;
  memset(auStack_1b0,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x601a6c);
  memset(auStack_198,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x601a9c);
  local_180 = 0;
  local_178 = 0;
  local_170 = 0;
  local_168 = 0;
  local_160 = 0;
  memset(auStack_158,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x601b08);
  memset(local_140,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x601b38);
  memset(local_128,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x601b68);
  memset(local_110,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x601b98);
  memset(local_110 + 0x18,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x601bc8);
  local_2f0 = 0;
  local_2e8 = in_stack_00000050;
  local_2e0 = 1;
  local_2d8 = in_stack_00000060;
  if (in_stack_00000058 == 0) {
    local_480 = in_stack_00000050 + -1;
  }
  else {
    local_480 = in_stack_00000058;
  }
  local_2d0 = local_480;
  local_2c8 = in_stack_00000070 & 1;
  local_2c0 = in_stack_00000120;
  local_270 = in_stack_000000a0;
  local_26c = in_stack_000000a8;
  local_268 = in_stack_00000098;
  if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    local_48c = *(undefined4 *)
                 ((long)&in_RSI[1].
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
  else {
    local_48c = *(undefined4 *)
                 ((long)&in_RDI[1].
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
  local_264 = local_48c;
  local_260 = in_stack_00000080 & 1;
  local_25f = bVar14 & 1;
  if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    local_4a0 = in_stack_00000028;
  }
  else {
    local_4a0 = 0;
  }
  local_258 = local_4a0;
  local_250 = in_stack_00000030;
  local_248 = in_stack_00000038;
  local_243 = 0;
  local_242 = 0;
  local_241 = 0;
  local_240 = in_stack_000000b0;
  local_23c = in_stack_000000b8;
  local_238 = in_stack_000000d0;
  local_2c7 = bVar10;
  local_2b8 = bVar9;
  local_244 = bVar11;
  if ((in_XMM2_Qa != 0.0) || (NAN(in_XMM2_Qa))) {
    if (local_1c8 == 0) {
      colmajor_to_rowmajor<float>
                ((float *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988,
                 (size_t)in_stack_fffffffffffff980,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff978);
    }
    else {
      in_stack_fffffffffffff968 = (pointer)local_110;
      in_stack_fffffffffffff970 = (InputData<float,_unsigned_long> *)(local_110 + 0x18);
      colmajor_to_rowmajor<float,unsigned_long>
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 (size_t)in_stack_fffffffffffffa88,(size_t)in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa78,in_stack_fffffffffffffab0,in_stack_fffffffffffffab8);
    }
  }
  nthreads = (int)in_stack_fffffffffffffaa0;
  __s = operator_new(0x800);
  memset(__s,0,0x800);
  WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>::WorkerMemory
            (in_stack_fffffffffffffa80);
  std::
  unique_ptr<WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>,std::default_delete<WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>>>
  ::
  unique_ptr<std::default_delete<WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>>,void>
            ((unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
              *)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  local_301 = 0;
  if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    local_300 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::size(in_RSI);
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::emplace_back<>((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      *)in_stack_fffffffffffff970);
  }
  else {
    local_300 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                std::
                vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ::size(in_RDI);
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::emplace_back<>((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      *)in_stack_fffffffffffff970);
  }
  local_301 = 1;
  if (in_stack_000000c8 != 0) {
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::emplace_back<>((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      *)in_stack_fffffffffffff970);
    input_data_00 =
         (InputData<float,_unsigned_long> *)
         std::
         vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
         ::back((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                 *)in_stack_fffffffffffff970);
  }
  if (in_stack_000000d8 != 0) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::emplace_back<>
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_fffffffffffff970);
  }
  SignalSwitcher::SignalSwitcher((SignalSwitcher *)in_stack_fffffffffffff970);
  check_interrupt_switch(in_stack_fffffffffffff980);
  if (in_RDI != (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            *)in_stack_fffffffffffff970);
  }
  if (in_RSI != (vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 *)0x0) {
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            *)in_stack_fffffffffffff970);
  }
  std::
  unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
  ::operator*((unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
               *)in_stack_fffffffffffff970);
  tree = local_300;
  fit_itree<InputData<float,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>,long_double>
            ((vector<IsoTree,_std::allocator<IsoTree>_> *)
             CONCAT17(bVar14,CONCAT16(bVar2,in_stack_ffffffffffffff50)),in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40,input_data_00,
             (ModelParams *)CONCAT44(iVar13,in_stack_ffffffffffffff30),impute_nodes_00,
             in_XMM4_Qa.m_mask);
  check_interrupt_switch(in_stack_fffffffffffff980);
  if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            *)in_stack_fffffffffffff970);
    std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::shrink_to_fit
              ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x602224);
    local_4d2 = 1;
    if (((ulong)in_RSI[2].
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      local_4d2 = in_stack_00000070 & 1;
    }
    *(byte *)&in_RSI[2].
              super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_4d2;
  }
  else {
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            *)in_stack_fffffffffffff970);
    std::vector<IsoTree,_std::allocator<IsoTree>_>::shrink_to_fit
              ((vector<IsoTree,_std::allocator<IsoTree>_> *)0x6021b8);
    local_4d1 = 1;
    if (((ulong)in_RDI[2].
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      local_4d1 = in_stack_00000070 & 1;
    }
    *(byte *)&in_RDI[2].
              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_4d1;
  }
  if (in_stack_000000c8 != 0) {
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::back((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            *)in_stack_fffffffffffff970);
    std::vector<ImputeNode,_std::allocator<ImputeNode>_>::shrink_to_fit
              ((vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x602284);
  }
  if (in_stack_000000d8 != 0) {
    if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)0x0) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::
      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ::back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              *)in_stack_fffffffffffff970);
      build_terminal_node_mappings_single_tree
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff970,
                 (size_t *)tree,(vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x602350);
    }
    else {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::
      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ::back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              *)in_stack_fffffffffffff970);
      build_terminal_node_mappings_single_tree
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff970,
                 (size_t *)tree,(vector<IsoTree,_std::allocator<IsoTree>_> *)0x6022f7);
    }
    check_interrupt_switch(in_stack_fffffffffffff980);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_fffffffffffff970);
    bVar3 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff980);
    if (!bVar3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x602399);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)0x0) {
        in_stack_fffffffffffffac0 =
             std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                       ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                        in_stack_fffffffffffff970);
        pvVar7 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                           ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                            in_stack_fffffffffffff970);
        in_stack_fffffffffffffac8 = &pvVar7->node_distances;
        pvVar7 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                           ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                            in_stack_fffffffffffff970);
        in_stack_fffffffffffffad0 = &pvVar7->node_depths;
        pvVar7 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                           ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                            in_stack_fffffffffffff970);
        in_stack_fffffffffffffad8 = (TreesIndexer *)pvVar7->n_terminal;
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                *)in_stack_fffffffffffff970);
        build_dindex(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff980,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff978,
                     (size_t)in_stack_fffffffffffff970,tree);
      }
      else {
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   in_stack_fffffffffffff970);
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   in_stack_fffffffffffff970);
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   in_stack_fffffffffffff970);
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   in_stack_fffffffffffff970);
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                *)in_stack_fffffffffffff970);
        build_dindex(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff980,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff978,
                     (size_t)in_stack_fffffffffffff970,
                     (vector<IsoTree,_std::allocator<IsoTree>_> *)tree);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff980)
      ;
    }
    check_interrupt_switch(in_stack_fffffffffffff980);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_fffffffffffff970);
    bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff980);
    if (!bVar3) {
      pvVar7 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                         ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                          in_stack_fffffffffffff970);
      model_outputs_00 =
           (IsoForest *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     (&pvVar7->reference_points);
      model_outputs_ext_00 = (ExtIsoForest *)local_351;
      local_351._25_8_ = model_outputs_00;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x6025bf);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffff990,(size_type)in_stack_fffffffffffff988,
                 (allocator_type *)in_stack_fffffffffffff980);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x6025eb);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_351._25_8_;
      uVar8 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      operator_new__(uVar8);
      std::unique_ptr<double[],std::default_delete<double[]>>::
      unique_ptr<double*,std::default_delete<double[]>,void,bool>
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffff970,
                 (double *)tree);
      if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)0x0) {
        ExtIsoForest::ExtIsoForest((ExtIsoForest *)0x60288e);
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                *)in_stack_fffffffffffff970);
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::push_back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
        __first._M_current = (unsigned_long *)local_351._25_8_;
        uVar4 = (uint)bVar2;
        uVar12 = in_stack_000000e0._7_1_;
        std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                  ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffff970
                  );
        in_stack_fffffffffffff970 = in_stack_00000118;
        this = in_stack_00000110;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x602987);
        __last._M_current = (unsigned_long *)0x0;
        in_stack_fffffffffffff980 = (SignalSwitcher *)0x0;
        in_stack_fffffffffffffa10 = this;
        predict_iforest(in_stack_000000f8,(int *)in_stack_000000e8,(bool)uVar12,
                        CONCAT44(uVar4,in_stack_fffffffffffffa18),(size_t)this,
                        (float *)in_stack_fffffffffffff970,in_stack_fffffffffffffa70,
                        (size_t *)in_stack_fffffffffffffa78,(float *)in_stack_fffffffffffffa80,
                        in_stack_fffffffffffffa88,in_stack_fffffffffffffa90,
                        (size_t)in_stack_fffffffffffffa98,nthreads,(bool)standardize,
                        model_outputs_00,model_outputs_ext_00,(double *)in_stack_fffffffffffffac0,
                        (size_t *)in_stack_fffffffffffffac8,(double *)in_stack_fffffffffffffad0,
                        in_stack_fffffffffffffad8);
        ExtIsoForest::~ExtIsoForest((ExtIsoForest *)0x602a4c);
      }
      else {
        iVar13 = (int)local_3a8;
        IsoForest::IsoForest((IsoForest *)0x602651);
        local_390 = *(undefined4 *)
                     &in_RDI[1].
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_38c = *(undefined4 *)
                     ((long)&in_RDI[1].
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4);
        local_388 = *(undefined4 *)
                     &in_RDI[1].
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                *)in_stack_fffffffffffff970);
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::push_back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
        __first._M_current = (unsigned_long *)local_351._25_8_;
        std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                  ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffff970
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x60274a);
        __last._M_current = (unsigned_long *)0x0;
        in_stack_fffffffffffff980 = (SignalSwitcher *)0x0;
        predict_iforest(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,(bool)uVar12,
                        CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                        (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                        in_stack_000000e0,in_stack_000000e8,in_stack_000000f8,in_stack_00000100,
                        in_stack_00000108,(size_t)&stack0xfffffffffffff968,iVar13,(bool)standardize,
                        model_outputs_00,model_outputs_ext_00,(double *)in_stack_fffffffffffffac0,
                        (size_t *)in_stack_fffffffffffffac8,(double *)in_stack_fffffffffffffad0,
                        in_stack_fffffffffffffad8);
        IsoForest::~IsoForest((IsoForest *)0x60280f);
        this = in_stack_00000110;
        in_stack_fffffffffffff970 = in_stack_00000118;
      }
      std::unique_ptr<double[],_std::default_delete<double[]>_>::reset
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffff970,
                 this);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                (&this->terminal_node_mappings);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->terminal_node_mappings)
      ;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff980,
                 __first,__last);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x602b08);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::back
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffff970);
      build_ref_node(in_stack_fffffffffffffa10);
      std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffff970);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff980)
      ;
    }
    check_interrupt_switch(in_stack_fffffffffffff980);
  }
  SignalSwitcher::~SignalSwitcher((SignalSwitcher *)in_stack_fffffffffffff970);
  std::
  unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
  ::~unique_ptr((unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                 *)in_stack_fffffffffffff970);
  InputData<float,_unsigned_long>::~InputData(in_stack_fffffffffffff970);
  return 0;
}

Assistant:

int add_tree_internal(
             IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
             real_t numeric_data[],  size_t ncols_numeric,
             int    categ_data[],    size_t ncols_categ,    int ncat[],
             real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
             size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
             real_t sample_weights[], size_t nrows,
             size_t max_depth,     size_t ncols_per_tree,
             bool   limit_depth,   bool penalize_range, bool standardize_data,
             bool   fast_bratio,
             real_t col_weights[], bool weigh_by_kurt,
             double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
             double prob_pick_by_full_gain, double prob_pick_by_dens,
             double prob_pick_col_by_range, double prob_pick_col_by_var,
             double prob_pick_col_by_kurt,
             double min_gain, MissingAction missing_action,
             CategSplit cat_split_type, NewCategAction new_cat_action,
             UseDepthImp depth_imp, WeighImpRows weigh_imp_rows,
             bool   all_perm, Imputer *imputer, size_t min_imp_obs,
             TreesIndexer *indexer,
             real_t ref_numeric_data[], int ref_categ_data[],
             bool ref_is_col_major, size_t ref_ld_numeric, size_t ref_ld_categ,
             real_t ref_Xc[], sparse_ix ref_Xc_ind[], sparse_ix ref_Xc_indptr[],
             uint64_t random_seed)
{
    if (
        prob_pick_by_gain_avg  < 0  || prob_pick_by_gain_pl  < 0 ||
        prob_pick_by_full_gain < 0  || prob_pick_by_dens     < 0 ||
        prob_pick_col_by_range < 0  ||
        prob_pick_col_by_var   < 0  || prob_pick_col_by_kurt < 0
    ) {
        throw std::runtime_error("Cannot pass negative probabilities.\n");
    }
    if (prob_pick_col_by_range && ncols_categ)
        throw std::runtime_error("'prob_pick_col_by_range' is not compatible with categorical data.\n");
    if (prob_pick_by_full_gain && ncols_categ)
        throw std::runtime_error("'prob_pick_by_full_gain' is not compatible with categorical data.\n");
    if (prob_pick_col_by_kurt && weigh_by_kurt)
        throw std::runtime_error("'weigh_by_kurt' and 'prob_pick_col_by_kurt' cannot be used together.\n");
    if (ndim == 0 && model_outputs == NULL)
        throw std::runtime_error("Must pass 'ndim>0' in the extended model.\n");
    if (indexer != NULL && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty()) {
        if (ref_numeric_data == NULL && ref_categ_data == NULL && ref_Xc_indptr == NULL)
            throw std::runtime_error("'indexer' has reference points. Those points must be passed to index them in the new tree to add.\n");
    }

    std::vector<ImputeNode> *impute_nodes = NULL;

    int max_categ = 0;
    for (size_t col = 0; col < ncols_categ; col++)
        max_categ = (ncat[col] > max_categ)? ncat[col] : max_categ;

    if (model_outputs != NULL)
        ntry = std::min(ntry, ncols_numeric + ncols_categ);

    if (ncols_per_tree == 0)
        ncols_per_tree = ncols_numeric + ncols_categ;

    if (indexer != NULL && indexer->indices.empty())
        indexer = NULL;

    InputData<real_t, sparse_ix>
              input_data     = {numeric_data, ncols_numeric, categ_data, ncat, max_categ, ncols_categ,
                                nrows, ncols_numeric + ncols_categ, sample_weights,
                                false, col_weights,
                                Xc, Xc_ind, Xc_indptr,
                                0, 0, std::vector<double>(),
                                std::vector<char>(), 0, NULL,
                                (double*)NULL, (double*)NULL, (int*)NULL, std::vector<double>(),
                                std::vector<double>(), std::vector<double>(),
                                std::vector<size_t>(), std::vector<size_t>()};
    ModelParams model_params = {false, nrows, (size_t)1, ncols_per_tree,
                                max_depth? max_depth : (nrows - 1),
                                penalize_range, standardize_data, random_seed, weigh_by_kurt,
                                prob_pick_by_gain_avg, prob_pick_by_gain_pl,
                                prob_pick_by_full_gain, prob_pick_by_dens,
                                prob_pick_col_by_range, prob_pick_col_by_var,
                                prob_pick_col_by_kurt,
                                min_gain, cat_split_type, new_cat_action, missing_action,
                                (model_outputs != NULL)? model_outputs->scoring_metric : model_outputs_ext->scoring_metric,
                                fast_bratio, all_perm,
                                (model_outputs != NULL)? 0 : ndim, ntry,
                                coef_type, coef_by_prop, false, false, false, depth_imp, weigh_imp_rows, min_imp_obs};

    if (prob_pick_by_full_gain)
    {
        if (input_data.Xc_indptr == NULL)
            colmajor_to_rowmajor(input_data.numeric_data, input_data.nrows, input_data.ncols_numeric, input_data.X_row_major);
        else
            colmajor_to_rowmajor(input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                 input_data.nrows, input_data.ncols_numeric,
                                 input_data.Xr, input_data.Xr_ind, input_data.Xr_indptr);
    }

    std::unique_ptr<WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t>> workspace(
        new WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t>()
    );

    size_t last_tree;
    bool added_tree = false;
    try
    {
        if (model_outputs != NULL)
        {
            last_tree = model_outputs->trees.size();
            model_outputs->trees.emplace_back();
            added_tree = true;
        }

        else
        {
            last_tree = model_outputs_ext->hplanes.size();
            model_outputs_ext->hplanes.emplace_back();
            added_tree = true;
        }

        if (imputer != NULL)
        {
            imputer->imputer_tree.emplace_back();
            impute_nodes = &(imputer->imputer_tree.back());
        }

        if (indexer != NULL)
        {
            indexer->indices.emplace_back();
        }

        SignalSwitcher ss = SignalSwitcher();
        check_interrupt_switch(ss);

        fit_itree<decltype(input_data), typename std::remove_pointer<decltype(workspace.get())>::type, ldouble_safe>(
                  (model_outputs != NULL)? &model_outputs->trees.back() : NULL,
                  (model_outputs_ext != NULL)? &model_outputs_ext->hplanes.back() : NULL,
                  *workspace,
                  input_data,
                  model_params,
                  impute_nodes,
                  last_tree);

        check_interrupt_switch(ss);

        if (model_outputs != NULL) {
            model_outputs->trees.back().shrink_to_fit();
            model_outputs->has_range_penalty = model_outputs->has_range_penalty || penalize_range;
        }
        else {
            model_outputs_ext->hplanes.back().shrink_to_fit();
            model_outputs_ext->has_range_penalty = model_outputs_ext->has_range_penalty || penalize_range;
        }

        if (imputer != NULL)
            imputer->imputer_tree.back().shrink_to_fit();

        if (indexer != NULL)
        {
            if (model_outputs != NULL)
                build_terminal_node_mappings_single_tree(indexer->indices.back().terminal_node_mappings,
                                                         indexer->indices.back().n_terminal,
                                                         model_outputs->trees.back());
            else
                build_terminal_node_mappings_single_tree(indexer->indices.back().terminal_node_mappings,
                                                         indexer->indices.back().n_terminal,
                                                         model_outputs_ext->hplanes.back());

            check_interrupt_switch(ss);


            if (!indexer->indices.front().node_distances.empty())
            {
                std::vector<size_t> temp;
                temp.reserve(indexer->indices.back().n_terminal);
                if (model_outputs != NULL) {
                    build_dindex(
                        temp,
                        indexer->indices.back().terminal_node_mappings,
                        indexer->indices.back().node_distances,
                        indexer->indices.back().node_depths,
                        indexer->indices.back().n_terminal,
                        model_outputs->trees.back()
                    );
                }
                else {
                    build_dindex(
                        temp,
                        indexer->indices.back().terminal_node_mappings,
                        indexer->indices.back().node_distances,
                        indexer->indices.back().node_depths,
                        indexer->indices.back().n_terminal,
                        model_outputs_ext->hplanes.back()
                    );
                }
            }

            check_interrupt_switch(ss);
            if (!indexer->indices.front().reference_points.empty())
            {
                size_t n_ref = indexer->indices.front().reference_points.size();
                std::vector<sparse_ix> terminal_indices(n_ref);
                std::unique_ptr<double[]> ignored(new double[n_ref]);
                if (model_outputs != NULL)
                {
                    IsoForest single_tree_model;
                    single_tree_model.new_cat_action = model_outputs->new_cat_action;
                    single_tree_model.cat_split_type = model_outputs->cat_split_type;
                    single_tree_model.missing_action = model_outputs->missing_action;
                    single_tree_model.trees.push_back(model_outputs->trees.back());

                    predict_iforest(ref_numeric_data, ref_categ_data,
                                    ref_is_col_major, ref_ld_numeric, ref_ld_categ,
                                    ref_Xc, ref_Xc_ind, ref_Xc_indptr,
                                    (real_t*)NULL, (sparse_ix*)NULL, (sparse_ix*)NULL,
                                    n_ref, 1, false,
                                    &single_tree_model, (ExtIsoForest*)NULL,
                                    ignored.get(), terminal_indices.data(),
                                    (double*)NULL,
                                    indexer);
                }

                else
                {
                    ExtIsoForest single_tree_model;
                    single_tree_model.new_cat_action = model_outputs_ext->new_cat_action;
                    single_tree_model.cat_split_type = model_outputs_ext->cat_split_type;
                    single_tree_model.missing_action = model_outputs_ext->missing_action;
                    single_tree_model.hplanes.push_back(model_outputs_ext->hplanes.back());

                    predict_iforest(ref_numeric_data, ref_categ_data,
                                    ref_is_col_major, ref_ld_numeric, ref_ld_categ,
                                    ref_Xc, ref_Xc_ind, ref_Xc_indptr,
                                    (real_t*)NULL, (sparse_ix*)NULL, (sparse_ix*)NULL,
                                    n_ref, 1, false,
                                    (IsoForest*)NULL, &single_tree_model,
                                    ignored.get(), terminal_indices.data(),
                                    (double*)NULL,
                                    indexer);
                }

                ignored.reset();
                indexer->indices.back().reference_points.assign(terminal_indices.begin(), terminal_indices.end());
                indexer->indices.back().reference_points.shrink_to_fit();
                build_ref_node(indexer->indices.back());
            }

            check_interrupt_switch(ss);
        }
    }

    catch (...)
    {
        if (added_tree)
        {
            if (model_outputs != NULL)
                model_outputs->trees.pop_back();
            else
                model_outputs_ext->hplanes.pop_back();
            if (imputer != NULL) {
                if (model_outputs != NULL)
                    imputer->imputer_tree.resize(model_outputs->trees.size());
                else
                    imputer->imputer_tree.resize(model_outputs_ext->hplanes.size());
            }
            if (indexer != NULL) {
                if (model_outputs != NULL)
                    indexer->indices.resize(model_outputs->trees.size());
                else
                    indexer->indices.resize(model_outputs_ext->hplanes.size());
            }
        }
        throw;
    }

    return EXIT_SUCCESS;
}